

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

double __thiscall despot::DESPOT::CheckDESPOT(DESPOT *this,VNode *vnode,double regularized_value)

{
  DSPOMDP *pDVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppSVar6;
  undefined4 extraout_var;
  VNode *this_00;
  clock_t cVar7;
  VNode *this_01;
  void *pvVar8;
  double dVar9;
  VNode *pruned;
  VNode *pVStack_b8;
  ACT_TYPE pruned_action;
  VNode *cur;
  double start;
  double pruned_value;
  int prev_num;
  int num_trials;
  double used_time;
  RandomStreams streams;
  double pruning_constant;
  VNode *root;
  value_type local_50;
  int local_44;
  undefined1 local_40 [4];
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  double regularized_value_local;
  VNode *vnode_local;
  DESPOT *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)VNode::particles(vnode);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40);
  for (local_44 = 0; uVar4 = (ulong)local_44,
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage), uVar4 < sVar5;
      local_44 = local_44 + 1) {
    pDVar1 = (this->super_Solver).model_;
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_44);
    iVar2 = (*pDVar1->_vptr_DSPOMDP[0x16])(pDVar1,*ppSVar6);
    local_50 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40,&local_50);
  }
  this_00 = (VNode *)operator_new(0x98);
  VNode::VNode(this_00,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40,0,
               (QNode *)0x0,0xffffffffffffffff);
  streams.position_ = (int)DAT_00278a80;
  streams._28_4_ = DAT_00278a80._4_4_;
  DAT_00278a80 = 0;
  RandomStreams::RandomStreams((RandomStreams *)&used_time,DAT_00278a6c,DAT_00278a70);
  RandomStreams::position((RandomStreams *)&used_time,0);
  InitBounds(this_00,this->lower_bound_,this->upper_bound_,(RandomStreams *)&used_time,
             &(this->super_Solver).history_);
  _prev_num = 0.0;
  pruned_value._4_4_ = 0;
  pruned_value._0_4_ = 0;
  do {
    do {
      cVar7 = clock();
      cur = (VNode *)(double)cVar7;
      pVStack_b8 = Trial(this_00,(RandomStreams *)&used_time,this->lower_bound_,this->upper_bound_,
                         (this->super_Solver).model_,&(this->super_Solver).history_,
                         (SearchStatistics *)0x0);
      pruned_value._4_4_ = pruned_value._4_4_ + 1;
      cVar7 = clock();
      _prev_num = _prev_num + ((double)cVar7 - (double)cur) / 1000000.0;
      cVar7 = clock();
      cur = (VNode *)(double)cVar7;
      Backup(pVStack_b8);
      cVar7 = clock();
      _prev_num = ((double)cVar7 - (double)cur) / 1000000.0 + _prev_num;
    } while ((double)(pruned_value._4_4_ - pruned_value._0_4_) <= (double)pruned_value._0_4_ * 0.05)
    ;
    DAT_00278a80._0_4_ = streams.position_;
    DAT_00278a80._4_4_ = streams._28_4_;
    this_01 = Prune(this_00,(ACT_TYPE *)((long)&pruned + 4),&start);
    DAT_00278a80 = 0;
    pruned_value._0_4_ = pruned_value._4_4_;
    VNode::Free(this_01,(this->super_Solver).model_);
    if (this_01 != (VNode *)0x0) {
      VNode::~VNode(this_01);
      operator_delete(this_01,0x98);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"# trials = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pruned_value._4_4_);
    poVar3 = std::operator<<(poVar3,"; target = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,regularized_value);
    poVar3 = std::operator<<(poVar3,", current = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,start);
    poVar3 = std::operator<<(poVar3,", l = ");
    dVar9 = VNode::lower_bound(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
    poVar3 = std::operator<<(poVar3,", u = ");
    dVar9 = VNode::upper_bound(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
    poVar3 = std::operator<<(poVar3,"; time = ");
    pvVar8 = (void *)std::ostream::operator<<(poVar3,_prev_num);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  } while (start < regularized_value);
  poVar3 = std::operator<<((ostream *)&std::cout,"DESPOT: # trials = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pruned_value._4_4_);
  poVar3 = std::operator<<(poVar3,"; target = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,regularized_value);
  poVar3 = std::operator<<(poVar3,", current = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,start);
  poVar3 = std::operator<<(poVar3,", l = ");
  dVar9 = VNode::lower_bound(this_00);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
  poVar3 = std::operator<<(poVar3,", u = ");
  dVar9 = VNode::upper_bound(this_00);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
  poVar3 = std::operator<<(poVar3,"; time = ");
  pvVar8 = (void *)std::ostream::operator<<(poVar3,_prev_num);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  DAT_00278a80._0_4_ = streams.position_;
  DAT_00278a80._4_4_ = streams._28_4_;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  VNode::Free(this_00,(this->super_Solver).model_);
  if (this_00 != (VNode *)0x0) {
    VNode::~VNode(this_00);
    operator_delete(this_00,0x98);
  }
  dVar9 = _prev_num;
  RandomStreams::~RandomStreams((RandomStreams *)&used_time);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40);
  return dVar9;
}

Assistant:

double DESPOT::CheckDESPOT(const VNode* vnode, double regularized_value) {
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	const vector<State*>& particles = vnode->particles();
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i ++) {
		copy.push_back(model_->Copy(particles[i]));
	}
	VNode* root = new VNode(copy);

	double pruning_constant = Globals::config.pruning_constant;
	Globals::config.pruning_constant = 0;

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	streams.position(0);
	InitBounds(root, lower_bound_, upper_bound_, streams, history_);

	double used_time = 0;
	int num_trials = 0, prev_num = 0;
	double pruned_value;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound_, upper_bound_, model_, history_);
		num_trials++;
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		if (double(num_trials - prev_num) > 0.05 * prev_num) {
			ACT_TYPE pruned_action;
			Globals::config.pruning_constant = pruning_constant;
			VNode* pruned = Prune(root, pruned_action, pruned_value);
			Globals::config.pruning_constant = 0;
			prev_num = num_trials;

			pruned->Free(*model_);
			delete pruned;

			cout << "# trials = " << num_trials << "; target = "
				<< regularized_value << ", current = " << pruned_value
				<< ", l = " << root->lower_bound() << ", u = "
				<< root->upper_bound() << "; time = " << used_time << endl;

			if (pruned_value >= regularized_value) {
				break;
			}
		}
	} while (true);

	cout << "DESPOT: # trials = " << num_trials << "; target = "
		<< regularized_value << ", current = " << pruned_value << ", l = "
		<< root->lower_bound() << ", u = " << root->upper_bound() << "; time = "
		<< used_time << endl;
	Globals::config.pruning_constant = pruning_constant;
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	root->Free(*model_);
	delete root;

	return used_time;
}